

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall
QMenuPrivate::setCurrentAction
          (QMenuPrivate *this,QAction *action,int popup,SelectionReason reason,bool activateFirst)

{
  Data *pDVar1;
  QMenuPrivate *this_00;
  Data *pDVar2;
  Data *this_01;
  QObject *pQVar3;
  bool bVar4;
  char cVar5;
  FocusPolicy FVar6;
  long lVar7;
  QWidget *pQVar8;
  Node<QAction_*,_QWidget_*> *pNVar9;
  QWidget *pQVar10;
  QAction *pQVar11;
  FocusReason reason_00;
  QAction *pQVar12;
  QObject *menu;
  long in_FS_OFFSET;
  QRect local_58;
  undefined8 local_48;
  QAction *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar10 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this->field_0x421 = this->field_0x421 & 0xf7;
  local_40 = action;
  bVar4 = considerAction(this,action);
  if (!bVar4) {
    local_40 = (QAction *)0x0;
    action = (QAction *)0x0;
  }
  if ((((reason != SelectedFromKeyboard) &&
       (lVar7 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject), lVar7 != 0)) &&
      (pDVar1 = (this->causedPopup).action.wp.d, pDVar1 != (Data *)0x0)) &&
     (pQVar12 = (QAction *)(this->causedPopup).action.wp.value,
     pQVar12 != (QAction *)0x0 && *(int *)(pDVar1 + 4) != 0)) {
    this_00 = *(QMenuPrivate **)(lVar7 + 8);
    pDVar2 = (this_00->activeMenu).wp.d;
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar8 = (QWidget *)0x0;
    }
    else {
      pQVar8 = (QWidget *)(this_00->activeMenu).wp.value;
    }
    if ((pQVar8 == pQVar10) && ((this->field_0x420 & 0x40) != 0)) {
      pQVar11 = (QAction *)0x0;
      if (*(int *)(pDVar1 + 4) != 0) {
        pQVar11 = pQVar12;
      }
      if (pQVar11 != this_00->currentAction) {
        if (*(int *)(pDVar1 + 4) == 0) {
          pQVar12 = (QAction *)0x0;
        }
        setCurrentAction(this_00,pQVar12,0,reason,false);
      }
    }
  }
  if (this->currentAction != (QAction *)0x0) {
    local_58 = actionRect(this,this->currentAction);
    QWidget::update(pQVar10,&local_58);
  }
  pDVar1 = (this->activeMenu).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    menu = (QObject *)0x0;
  }
  else {
    menu = (this->activeMenu).wp.value;
  }
  pQVar12 = this->currentAction;
  this->currentAction = action;
  if (action == (QAction *)0x0) {
    if (pQVar12 != (QAction *)0x0) {
      pQVar3 = *(QObject **)(pQVar12 + 8);
      pQVar10 = topCausedWidget(this);
      local_58 = (QRect)ZEXT816(0);
      local_48 = 0;
      QActionPrivate::showStatusText(pQVar3,(QString *)pQVar10);
      if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
        }
      }
    }
  }
  else {
    cVar5 = QAction::isSeparator();
    if (cVar5 == '\0') {
      activateAction(this,action,Hover,true);
      if ((popup != -1) && ((pQVar10->data->widget_attributes & 0x8000) != 0)) {
        popupAction(this,this->currentAction,popup,activateFirst);
      }
      local_58 = actionRect(this,action);
      QWidget::update(pQVar10,&local_58);
      if (reason == SelectedFromKeyboard) {
        this_01 = (this->widgetItems).d;
        if (((this_01 == (Data *)0x0) ||
            (pNVar9 = QHashPrivate::Data<QHashPrivate::Node<QAction*,QWidget*>>::findNode<QAction*>
                                ((Data<QHashPrivate::Node<QAction*,QWidget*>> *)this_01,&local_40),
            pNVar9 == (Node<QAction_*,_QWidget_*> *)0x0)) ||
           (pQVar8 = pNVar9->value, pQVar8 == (QWidget *)0x0)) {
          bVar4 = QWidget::hasFocus(pQVar10);
          if (!bVar4) {
            reason_00 = PopupFocusReason;
            goto LAB_0045644c;
          }
        }
        else {
          FVar6 = QWidget::focusPolicy(pQVar8);
          if (FVar6 != NoFocus) {
            reason_00 = TabFocusReason;
            pQVar10 = pQVar8;
LAB_0045644c:
            QWidget::setFocus(pQVar10,reason_00);
          }
        }
      }
    }
  }
  if ((menu != (QObject *)0x0) && (pQVar12 != this->currentAction)) {
    if (popup == -1) {
      qFadeEffect((QWidget *)0x0,-1);
      qScrollEffect((QWidget *)0x0,8,-1);
      hideMenu(this,(QMenu *)menu);
    }
    else {
      if (this->currentAction != (QAction *)0x0) {
        QAction::menuObject();
        lVar7 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
        if (lVar7 != 0) goto LAB_004564c0;
      }
      QMenuSloppyState::startTimerIfNotRunning(&this->sloppyState);
    }
  }
LAB_004564c0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::setCurrentAction(QAction *action, int popup, SelectionReason reason, bool activateFirst)
{
    Q_Q(QMenu);
    tearoffHighlighted = 0;

    if (!considerAction(action))
        action = nullptr;

    // Reselect the currently active action in case mouse moved over other menu items when
    // moving from sub menu action to sub menu (QTBUG-20094).
    if (reason != SelectedFromKeyboard) {
        if (QMenu *menu = qobject_cast<QMenu*>(causedPopup.widget)) {
            if (causedPopup.action && menu->d_func()->activeMenu == q)
                // Reselect parent menu action only if mouse is over a menu and parent menu action is not already selected (QTBUG-47987)
                if (hasReceievedEnter && menu->d_func()->currentAction != causedPopup.action)
                    menu->d_func()->setCurrentAction(causedPopup.action, 0, reason, false);
        }
    }

    if (currentAction)
        q->update(actionRect(currentAction));

    QMenu *hideActiveMenu = activeMenu;
    QAction *previousAction = currentAction;

    currentAction = action;
    if (action) {
        if (!action->isSeparator()) {
            activateAction(action, QAction::Hover);
            if (popup != -1) {
                // if the menu is visible then activate the required action,
                // otherwise we just mark the action as currentAction
                // and activate it when the menu will be popuped.
                if (q->isVisible())
                    popupAction(currentAction, popup, activateFirst);
            }
            q->update(actionRect(action));

            if (reason == SelectedFromKeyboard) {
                QWidget *widget = widgetItems.value(action);
                if (widget) {
                    if (widget->focusPolicy() != Qt::NoFocus)
                        widget->setFocus(Qt::TabFocusReason);
                } else {
                    //when the action has no QWidget, the QMenu itself should
                    // get the focus
                    // Since the menu is a pop-up, it uses the popup reason.
                    if (!q->hasFocus()) {
                        q->setFocus(Qt::PopupFocusReason);
                    }
                }
            }
        }
#if QT_CONFIG(statustip)
    }  else if (previousAction) {
        previousAction->d_func()->showStatusText(topCausedWidget(), QString());
#endif
    }
    if (hideActiveMenu && previousAction != currentAction) {
        if (popup == -1) {
#if QT_CONFIG(effects)
            // kill any running effect
            qFadeEffect(nullptr);
            qScrollEffect(nullptr);
#endif
            hideMenu(hideActiveMenu);
        } else if (!currentAction || !currentAction->menu()) {
            sloppyState.startTimerIfNotRunning();
        }
    }
}